

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

char * unescape_word(Curl_easy *data,char *inputbuff)

{
  char cVar1;
  CURLcode CVar2;
  int local_50;
  int olen;
  char ch;
  char *ptr;
  size_t sStack_38;
  CURLcode result;
  size_t len;
  char *dictp;
  char *newp;
  char *inputbuff_local;
  Curl_easy *data_local;
  
  dictp = (char *)0x0;
  newp = inputbuff;
  inputbuff_local = (char *)data;
  CVar2 = Curl_urldecode(data,inputbuff,0,&dictp,&stack0xffffffffffffffc8,false);
  if ((dictp == (char *)0x0) || (CVar2 != CURLE_OK)) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    len = (size_t)(*Curl_cmalloc)(sStack_38 * 2 + 1);
    if ((void *)len != (void *)0x0) {
      local_50 = 0;
      for (_olen = dictp; cVar1 = *_olen, cVar1 != '\0'; _olen = _olen + 1) {
        if ((((cVar1 < '!') || (cVar1 == '\x7f')) || (cVar1 == '\'')) ||
           ((cVar1 == '\"' || (cVar1 == '\\')))) {
          *(undefined1 *)(len + (long)local_50) = 0x5c;
          local_50 = local_50 + 1;
        }
        *(char *)(len + (long)local_50) = cVar1;
        local_50 = local_50 + 1;
      }
      *(undefined1 *)(len + (long)local_50) = 0;
    }
    (*Curl_cfree)(dictp);
    data_local = (Curl_easy *)len;
  }
  return (char *)data_local;
}

Assistant:

static char *unescape_word(struct Curl_easy *data, const char *inputbuff)
{
  char *newp = NULL;
  char *dictp;
  size_t len;

  CURLcode result = Curl_urldecode(data, inputbuff, 0, &newp, &len, FALSE);
  if(!newp || result)
    return NULL;

  dictp = malloc(len*2 + 1); /* add one for terminating zero */
  if(dictp) {
    char *ptr;
    char ch;
    int olen = 0;
    /* According to RFC2229 section 2.2, these letters need to be escaped with
       \[letter] */
    for(ptr = newp;
        (ch = *ptr) != 0;
        ptr++) {
      if((ch <= 32) || (ch == 127) ||
          (ch == '\'') || (ch == '\"') || (ch == '\\')) {
        dictp[olen++] = '\\';
      }
      dictp[olen++] = ch;
    }
    dictp[olen] = 0;
  }
  free(newp);
  return dictp;
}